

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMDocumentImpl::removeRange(DOMDocumentImpl *this,DOMRangeImpl *range)

{
  XMLSize_t XVar1;
  DOMRangeImpl *pDVar2;
  XMLSize_t local_28;
  XMLSize_t i;
  XMLSize_t sz;
  DOMRangeImpl *range_local;
  DOMDocumentImpl *this_local;
  
  if ((this->fRanges != (Ranges *)0x0) &&
     (XVar1 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::size
                        (&this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>),
     XVar1 != 0)) {
    for (local_28 = 0; local_28 < XVar1; local_28 = local_28 + 1) {
      pDVar2 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt
                         (&this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>,local_28)
      ;
      if (pDVar2 == range) {
        (*(this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>)._vptr_BaseRefVectorOf[4]
        )(this->fRanges,local_28);
        return;
      }
    }
  }
  return;
}

Assistant:

void DOMDocumentImpl::removeRange(DOMRangeImpl* range)
{
    if (fRanges != 0) {
        XMLSize_t sz = fRanges->size();
        if (sz !=0) {
            for (XMLSize_t i =0; i<sz; i++) {
                if (fRanges->elementAt(i) == range) {
                    fRanges->removeElementAt(i);
                    break;
                }
            }
        }
    }
}